

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O0

error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>
* __thiscall
pstore::http::details::
read_and_byte_swap<unsigned_long,pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_long>
           *__return_storage_ptr__,details *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io)

{
  descriptor<pstore::details::posix_descriptor_traits> *io_00;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_60;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<unsigned_long,__1L>::element_type>_>
  local_50;
  anon_class_1_0_00000001 local_29;
  unsigned_long local_28;
  unsigned_long v;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *reader_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  local_28 = 0;
  v = (unsigned_long)this;
  reader_local = reader;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  io_00 = std::reference_wrapper::operator_cast_to_descriptor_((reference_wrapper *)&reader_local);
  local_60 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
             pstore::gsl::make_span<unsigned_long>(&local_28,1);
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::get_span<pstore::gsl::span<unsigned_long,_1l>>
            (&local_50,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)this,io_00,(span<unsigned_long,__1L> *)&local_60);
  pstore::operator>>=(__return_storage_ptr__,&local_50,&local_29);
  error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::span<unsigned_long,_-1L>_>_>
  ::~error_or(&local_50);
  return __return_storage_ptr__;
}

Assistant:

error_or_n<IO, T> read_and_byte_swap (Reader & reader, IO io) {
                auto v = T{0};
                return reader.get_span (io, gsl::make_span (&v, 1)) >>=
                       [] (IO io2, gsl::span<T> const & l1) {
                           return error_or_n<IO, T>{in_place, io2, network_to_host (l1.at (0))};
                       };
            }